

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildScalarEvolutionAnalysis(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::ScalarEvolutionAnalysis,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ::operator=(&this->scalar_evolution_analysis_,&local_18);
  std::
  unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ::~unique_ptr(&local_18);
  AVar1 = operator|(this->valid_analyses_,kAnalysisScalarEvolution);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildScalarEvolutionAnalysis() {
    scalar_evolution_analysis_ = MakeUnique<ScalarEvolutionAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisScalarEvolution;
  }